

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc.c
# Opt level: O3

int dlmalloc_trim(size_t pad)

{
  int iVar1;
  uint uVar2;
  size_t in_RSI;
  
  if (mparams.magic == 0) {
    init_mparams();
  }
  iVar1 = _gm_.mutex;
  if (((byte)_gm_.mflags & 2) != 0) {
    uVar2 = 1;
    LOCK();
    _gm_.mutex = 1;
    UNLOCK();
    if (iVar1 != 0) {
      while (_gm_.mutex != 0) {
        if ((uVar2 & 0x3f) == 0) {
          sched_yield();
        }
        uVar2 = uVar2 + 1;
      }
      LOCK();
      _gm_.mutex = 1;
      UNLOCK();
    }
  }
  iVar1 = sys_trim((mstate)pad,in_RSI);
  if (((byte)_gm_.mflags & 2) != 0) {
    _gm_.mutex = 0;
  }
  return iVar1;
}

Assistant:

int dlmalloc_trim(size_t pad) {
  int result = 0;
  ensure_initialization();
  if (!PREACTION(gm)) {
    result = sys_trim(gm, pad);
    POSTACTION(gm);
  }
  return result;
}